

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isSVD(iso9660 *iso9660,uchar *h)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *in_RSI;
  int32_t location;
  int32_t volume_block;
  ssize_t logical_block_size;
  uchar *p;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  iso9660 *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_RSI == '\x02') {
    iVar2 = isNull(in_stack_ffffffffffffffd8,
                   (uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      iVar2 = isNull(in_stack_ffffffffffffffd8,
                     (uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        iVar2 = isNull(in_stack_ffffffffffffffd8,
                       (uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else if (in_RSI[0x371] == '\x01') {
          uVar1 = archive_le16dec(in_RSI + 0x80);
          if (uVar1 == 0) {
            local_4 = 0;
          }
          else {
            uVar3 = archive_le32dec(in_RSI + 0x50);
            if ((int)uVar3 < 0x15) {
              local_4 = 0;
            }
            else {
              uVar4 = archive_le32dec(in_RSI + 0x8c);
              if (((int)uVar4 < 0x12) || ((int)uVar3 <= (int)uVar4)) {
                local_4 = 0;
              }
              else {
                uVar4 = archive_be32dec(in_RSI + 0x94);
                if ((((int)uVar4 < 1) || (0x11 < (int)uVar4)) && ((int)uVar4 < (int)uVar3)) {
                  if (in_RSI[0x9c] == '\"') {
                    local_4 = 0x30;
                  }
                  else {
                    local_4 = 0;
                  }
                }
                else {
                  local_4 = 0;
                }
              }
            }
          }
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
isSVD(struct iso9660 *iso9660, const unsigned char *h)
{
	const unsigned char *p;
	ssize_t logical_block_size;
	int32_t volume_block;
	int32_t location;

	(void)iso9660; /* UNUSED */

	/* Type 2 means it's a SVD. */
	if (h[SVD_type_offset] != 2)
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, SVD_reserved1_offset, SVD_reserved1_size))
		return (0);
	if (!isNull(iso9660, h, SVD_reserved2_offset, SVD_reserved2_size))
		return (0);
	if (!isNull(iso9660, h, SVD_reserved3_offset, SVD_reserved3_size))
		return (0);

	/* File structure version must be 1 for ISO9660/ECMA119. */
	if (h[SVD_file_structure_version_offset] != 1)
		return (0);

	logical_block_size =
	    archive_le16dec(h + SVD_logical_block_size_offset);
	if (logical_block_size <= 0)
		return (0);

	volume_block = archive_le32dec(h + SVD_volume_space_size_offset);
	if (volume_block <= SYSTEM_AREA_BLOCK+4)
		return (0);

	/* Location of Occurrence of Type L Path Table must be
	 * available location,
	 * >= SYSTEM_AREA_BLOCK(16) + 2 and < Volume Space Size. */
	location = archive_le32dec(h+SVD_type_L_path_table_offset);
	if (location < SYSTEM_AREA_BLOCK+2 || location >= volume_block)
		return (0);

	/* The Type M Path Table must be at a valid location (WinISO
	 * and probably other programs omit this, so we allow zero)
	 *
	 * >= SYSTEM_AREA_BLOCK(16) + 2 and < Volume Space Size. */
	location = archive_be32dec(h+SVD_type_M_path_table_offset);
	if ((location > 0 && location < SYSTEM_AREA_BLOCK+2)
	    || location >= volume_block)
		return (0);

	/* Read Root Directory Record in Volume Descriptor. */
	p = h + SVD_root_directory_record_offset;
	if (p[DR_length_offset] != 34)
		return (0);

	return (48);
}